

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_partial_forceExtDict
              (char *source,char *dest,int compressedSize,int targetOutputSize,int dstCapacity,
              void *dictStart,size_t dictSize)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  ushort uVar4;
  undefined8 uVar5;
  char cVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ushort *puVar11;
  size_t __n;
  ushort *puVar12;
  BYTE *e;
  ulong uVar13;
  byte *pbVar14;
  byte *pbVar15;
  BYTE *d;
  byte *pbVar16;
  byte *pbVar17;
  BYTE *s;
  ushort *puVar18;
  ulong uVar19;
  ushort *puVar20;
  ushort *puVar21;
  uint uVar22;
  ulong uStack_a0;
  int local_78;
  
  if (targetOutputSize < dstCapacity) {
    dstCapacity = targetOutputSize;
  }
  puVar21 = (ushort *)0xffffffffffffffff;
  if (-1 < dstCapacity && source != (char *)0x0) {
    lVar8 = dictSize + (long)dictStart;
    if (dictStart == (void *)0x0) {
      lVar8 = 0;
    }
    if (dstCapacity == 0) {
      puVar21 = (ushort *)0x0;
    }
    else if (compressedSize != 0) {
      pbVar1 = (byte *)(source + compressedSize);
      pbVar2 = (byte *)(dest + (uint)dstCapacity);
      puVar11 = (ushort *)source;
      pbVar16 = (byte *)dest;
      if ((uint)dstCapacity < 0x40) goto LAB_0010db6b;
      puVar12 = (ushort *)(pbVar1 + -0xf);
      pbVar15 = (byte *)dest;
      puVar21 = (ushort *)source;
LAB_0010d3eb:
      do {
        uVar9 = 0xf;
        puVar20 = (ushort *)((long)puVar21 + 1);
        bVar3 = (byte)*puVar21;
        uVar22 = (uint)bVar3;
        uStack_a0 = (ulong)(uint)(bVar3 >> 4);
        if (bVar3 >> 4 == 0xf) {
          puVar18 = puVar20;
          if ((puVar20 < puVar12) && (puVar18 = puVar21 + 1, puVar18 <= puVar12)) {
            uStack_a0 = (ulong)*(byte *)puVar20;
            if (uStack_a0 == 0xff) {
              uStack_a0 = 0xff;
              puVar21 = (ushort *)((long)puVar21 + 3);
              do {
                puVar18 = puVar21;
                puVar21 = puVar18;
                if (puVar12 < puVar18) goto LAB_0010d6ad;
                uStack_a0 = uStack_a0 + *(byte *)((long)puVar18 + -1);
                puVar21 = (ushort *)((long)puVar18 + 1);
              } while ((ulong)*(byte *)((long)puVar18 + -1) == 0xff);
            }
          }
          else {
LAB_0010d6ad:
            uStack_a0 = 0xffffffffffffffff;
          }
          if (uStack_a0 == 0xffffffffffffffff) {
            iVar7 = 5;
            uStack_a0 = uVar9;
          }
          else {
            uStack_a0 = uStack_a0 + 0xf;
            pbVar16 = pbVar15 + uStack_a0;
            if ((CARRY8((ulong)pbVar15,uStack_a0)) || (CARRY8((ulong)puVar18,uStack_a0))) {
              iVar7 = 5;
            }
            else if ((dest + ((ulong)(uint)dstCapacity - 0x20) < pbVar16) ||
                    (pbVar1 + -0x20 < (ushort *)((long)puVar18 + uStack_a0))) {
              iVar7 = 6;
            }
            else {
              lVar10 = 0;
              do {
                uVar5 = *(undefined8 *)((byte *)((long)puVar18 + lVar10) + 8);
                pbVar17 = pbVar15 + lVar10;
                *(undefined8 *)pbVar17 = *(undefined8 *)((long)puVar18 + lVar10);
                *(undefined8 *)(pbVar17 + 8) = uVar5;
                pbVar14 = (byte *)((long)puVar18 + lVar10 + 0x10);
                uVar5 = *(undefined8 *)(pbVar14 + 8);
                *(undefined8 *)(pbVar17 + 0x10) = *(undefined8 *)pbVar14;
                *(undefined8 *)(pbVar17 + 0x18) = uVar5;
                lVar10 = lVar10 + 0x20;
              } while (pbVar17 + 0x20 < pbVar16);
              iVar7 = 0;
              pbVar15 = pbVar16;
              puVar18 = (ushort *)((long)puVar18 + uStack_a0);
            }
          }
          pbVar17 = pbVar15;
          if (iVar7 != 0) {
            puVar11 = puVar18;
            if (iVar7 == 5) goto LAB_0010dbe1;
            puVar20 = puVar18;
            if (iVar7 == 6) goto LAB_0010d8dd;
            break;
          }
        }
        else {
          if (pbVar1 + -0x11 < puVar20) goto LAB_0010d8dd;
          uVar5 = *(undefined8 *)((long)puVar21 + 9);
          *(undefined8 *)pbVar15 = *(undefined8 *)puVar20;
          *(undefined8 *)(pbVar15 + 8) = uVar5;
          puVar18 = (ushort *)((long)puVar20 + uStack_a0);
          pbVar17 = pbVar15 + uStack_a0;
        }
        uVar4 = *puVar18;
        uVar13 = (ulong)uVar4;
        puVar21 = puVar18 + 1;
        pbVar14 = pbVar17 + -uVar13;
        uVar19 = (ulong)(bVar3 & 0xf);
        if (uVar19 == 0xf) {
          puVar11 = (ushort *)((long)puVar18 + 3);
          if (pbVar1 + -4 < puVar11) {
LAB_0010d70b:
            uStack_a0 = 0xffffffffffffffff;
          }
          else {
            uStack_a0 = (ulong)(byte)*puVar21;
            if (uStack_a0 == 0xff) {
              uStack_a0 = 0xff;
              puVar20 = puVar18 + 2;
              do {
                puVar11 = puVar20;
                if (pbVar1 + -4 < puVar11) goto LAB_0010d70b;
                uStack_a0 = uStack_a0 + *(byte *)((long)puVar11 + -1);
                puVar20 = (ushort *)((long)puVar11 + 1);
              } while ((ulong)*(byte *)((long)puVar11 + -1) == 0xff);
            }
          }
          iVar7 = 5;
          if (uStack_a0 != 0xffffffffffffffff) {
            uVar9 = uStack_a0 + 0x13;
            if (CARRY8((ulong)pbVar17,uVar9)) {
              uStack_a0._0_4_ = 5;
              iVar7 = (int)uStack_a0;
            }
            else {
              iVar7 = 7;
              if (pbVar17 + uVar9 < pbVar2 + -0x40) {
                iVar7 = 0;
              }
            }
          }
          if (iVar7 != 0) {
            if (iVar7 == 5) goto LAB_0010dbe1;
            if (iVar7 != 7) break;
            goto LAB_0010d9e2;
          }
        }
        else {
          pbVar15 = pbVar17 + uVar19 + 4;
          uVar9 = uVar19 + 4;
          puVar11 = puVar21;
          if (pbVar2 + -0x40 <= pbVar15) goto LAB_0010d9e2;
          if ((dest <= pbVar14) && (7 < uVar4)) {
            *(undefined8 *)pbVar17 = *(undefined8 *)pbVar14;
            *(undefined8 *)(pbVar17 + 8) = *(undefined8 *)(pbVar14 + 8);
            *(undefined2 *)(pbVar17 + 0x10) = *(undefined2 *)(pbVar14 + 0x10);
            goto LAB_0010d3eb;
          }
        }
        if ((dictSize < 0x10000) && (pbVar14 + dictSize < dest)) goto LAB_0010dbe1;
        pbVar15 = pbVar17 + uVar9;
        puVar21 = puVar11;
        if (pbVar14 < dest) {
          if ((pbVar2 + -5 < pbVar15) && ((ulong)((long)pbVar2 - (long)pbVar17) <= uVar9)) {
            uVar9 = (long)pbVar2 - (long)pbVar17;
          }
          uVar19 = (long)dest - (long)pbVar14;
          uVar13 = uVar9 - uVar19;
          if (uVar9 < uVar19 || uVar13 == 0) {
            memmove(pbVar17,(void *)(lVar8 - uVar19),uVar9);
            pbVar15 = pbVar17 + uVar9;
          }
          else {
            memcpy(pbVar17,(void *)(lVar8 - uVar19),uVar19);
            pbVar15 = pbVar17 + uVar19;
            if ((ulong)((long)pbVar15 - (long)dest) < uVar13) {
              if ((long)uVar19 < (long)uVar9) {
                pbVar16 = (byte *)dest;
                do {
                  bVar3 = *pbVar16;
                  pbVar16 = pbVar16 + 1;
                  *pbVar15 = bVar3;
                  pbVar15 = pbVar15 + 1;
                } while (pbVar15 < pbVar17 + uVar9);
              }
            }
            else {
              memcpy(pbVar15,dest,uVar13);
              pbVar15 = pbVar17 + uVar9;
            }
          }
          goto LAB_0010d3eb;
        }
        if (uVar4 < 0x10) {
          if (uVar13 == 4) {
            iVar7 = *(int *)pbVar14;
          }
          else if (uVar4 == 2) {
            iVar7 = CONCAT22(*(undefined2 *)pbVar14,*(undefined2 *)pbVar14);
          }
          else {
            if (uVar4 != 1) {
              if (uVar4 < 8) {
                pbVar17[0] = 0;
                pbVar17[1] = 0;
                pbVar17[2] = 0;
                pbVar17[3] = 0;
                *pbVar17 = *pbVar14;
                pbVar17[1] = pbVar14[1];
                pbVar17[2] = pbVar14[2];
                pbVar17[3] = pbVar14[3];
                uVar22 = inc32table[uVar4];
                *(undefined4 *)(pbVar17 + 4) = *(undefined4 *)(pbVar14 + uVar22);
                pbVar14 = pbVar14 + ((ulong)uVar22 - (long)dec64table[uVar4]);
              }
              else {
                *(undefined8 *)pbVar17 = *(undefined8 *)pbVar14;
                pbVar14 = pbVar14 + 8;
              }
              pbVar17 = pbVar17 + 8;
              do {
                *(undefined8 *)pbVar17 = *(undefined8 *)pbVar14;
                pbVar17 = pbVar17 + 8;
                pbVar14 = pbVar14 + 8;
              } while (pbVar17 < pbVar15);
              goto LAB_0010d3eb;
            }
            iVar7 = (uint)*pbVar14 * 0x1010101;
          }
          *(int *)pbVar17 = iVar7;
          *(int *)(pbVar17 + 4) = iVar7;
          if (8 < (long)uVar9) {
            pbVar17 = pbVar17 + 8;
            do {
              *(int *)pbVar17 = iVar7;
              *(int *)(pbVar17 + 4) = iVar7;
              pbVar17 = pbVar17 + 8;
            } while (pbVar17 < pbVar15);
          }
          goto LAB_0010d3eb;
        }
        do {
          uVar5 = *(undefined8 *)(pbVar17 + -uVar13 + 8);
          *(undefined8 *)pbVar17 = *(undefined8 *)(pbVar17 + -uVar13);
          *(undefined8 *)(pbVar17 + 8) = uVar5;
          uVar5 = *(undefined8 *)(pbVar17 + -uVar13 + 0x10 + 8);
          *(undefined8 *)(pbVar17 + 0x10) = *(undefined8 *)(pbVar17 + -uVar13 + 0x10);
          *(undefined8 *)(pbVar17 + 0x18) = uVar5;
          pbVar17 = pbVar17 + 0x20;
        } while (pbVar17 < pbVar15);
      } while( true );
    }
  }
  goto LAB_0010dbf9;
LAB_0010d9e2:
  if ((dictSize < 0x10000) && (pbVar14 + dictSize < dest)) goto LAB_0010dbe1;
  pbVar16 = pbVar17 + uVar9;
  if (dest <= pbVar14) {
    if (pbVar16 <= pbVar2 + -0xc) {
      if ((uint)uVar13 < 8) {
        pbVar17[0] = 0;
        pbVar17[1] = 0;
        pbVar17[2] = 0;
        pbVar17[3] = 0;
        *pbVar17 = *pbVar14;
        pbVar17[1] = pbVar14[1];
        pbVar17[2] = pbVar14[2];
        pbVar17[3] = pbVar14[3];
        uVar13 = (ulong)((uint)uVar13 << 2);
        uVar19 = (ulong)*(uint *)((long)inc32table + uVar13);
        *(undefined4 *)(pbVar17 + 4) = *(undefined4 *)(pbVar14 + uVar19);
        pbVar14 = pbVar14 + (uVar19 - (long)*(int *)((long)dec64table + uVar13));
      }
      else {
        *(undefined8 *)pbVar17 = *(undefined8 *)pbVar14;
        pbVar14 = pbVar14 + 8;
      }
      *(undefined8 *)(pbVar17 + 8) = *(undefined8 *)pbVar14;
      if (0x10 < uVar9) {
        pbVar17 = pbVar17 + 0x10;
        do {
          pbVar14 = pbVar14 + 8;
          *(undefined8 *)pbVar17 = *(undefined8 *)pbVar14;
          pbVar17 = pbVar17 + 8;
        } while (pbVar17 < pbVar16);
      }
      goto LAB_0010db6b;
    }
    uVar13 = (long)pbVar2 - (long)pbVar17;
    if (uVar9 < (ulong)((long)pbVar2 - (long)pbVar17)) {
      uVar13 = uVar9;
    }
    pbVar16 = pbVar17 + uVar13;
    if (pbVar17 < pbVar14 + uVar13) {
      if (0 < (long)uVar13) {
        do {
          bVar3 = *pbVar14;
          pbVar14 = pbVar14 + 1;
          *pbVar17 = bVar3;
          pbVar17 = pbVar17 + 1;
        } while (pbVar17 < pbVar16);
      }
    }
    else {
      memcpy(pbVar17,pbVar14,uVar13);
    }
    if (pbVar16 != pbVar2) goto LAB_0010db6b;
LAB_0010dbf3:
    puVar21 = (ushort *)(ulong)(uint)((int)pbVar16 - (int)dest);
    goto LAB_0010dbf9;
  }
  if ((pbVar2 + -5 < pbVar16) && ((ulong)((long)pbVar2 - (long)pbVar17) <= uVar9)) {
    uVar9 = (long)pbVar2 - (long)pbVar17;
  }
  uVar19 = (long)dest - (long)pbVar14;
  uVar13 = uVar9 - uVar19;
  if (uVar9 < uVar19 || uVar13 == 0) {
    memmove(pbVar17,(void *)(lVar8 - uVar19),uVar9);
  }
  else {
    memcpy(pbVar17,(void *)(lVar8 - uVar19),uVar19);
    pbVar16 = pbVar17 + uVar19;
    if ((ulong)((long)pbVar16 - (long)dest) < uVar13) {
      if ((long)uVar19 < (long)uVar9) {
        pbVar15 = (byte *)dest;
        do {
          bVar3 = *pbVar15;
          pbVar15 = pbVar15 + 1;
          *pbVar16 = bVar3;
          pbVar16 = pbVar16 + 1;
        } while (pbVar16 < pbVar17 + uVar9);
      }
      goto LAB_0010db6b;
    }
    memcpy(pbVar16,dest,uVar13);
  }
  pbVar16 = pbVar17 + uVar9;
LAB_0010db6b:
  puVar20 = (ushort *)((long)puVar11 + 1);
  bVar3 = (byte)*puVar11;
  puVar21 = puVar11;
  pbVar15 = pbVar16;
  while( true ) {
    uVar22 = (uint)bVar3;
    if (bVar3 >> 4 == 0xf) break;
    uStack_a0 = (ulong)(uint)(bVar3 >> 4);
    if ((source + (long)compressedSize + -0x10 <= puVar20) ||
       (dest + ((ulong)(uint)dstCapacity - 0x20) < pbVar15)) goto LAB_0010d8dd;
    uVar5 = *(undefined8 *)(puVar20 + 4);
    *(undefined8 *)pbVar15 = *(undefined8 *)puVar20;
    *(undefined8 *)(pbVar15 + 8) = uVar5;
    pbVar16 = pbVar15 + uStack_a0;
    uVar9 = (ulong)(uVar22 & 0xf);
    puVar21 = (ushort *)(uStack_a0 + (long)puVar20) + 1;
    uVar4 = *(ushort *)(uStack_a0 + (long)puVar20);
    uVar13 = (ulong)uVar4;
    pbVar14 = pbVar16 + -uVar13;
    if (((uVar22 & 0xf) == 0xf) || ((uVar4 < 8 || (pbVar14 < dest)))) goto LAB_0010d986;
    *(undefined8 *)pbVar16 = *(undefined8 *)pbVar14;
    *(undefined8 *)(pbVar16 + 8) = *(undefined8 *)(pbVar14 + 8);
    *(undefined2 *)(pbVar16 + 0x10) = *(undefined2 *)(pbVar14 + 0x10);
    pbVar15 = pbVar16 + uVar9 + 4;
    bVar3 = *(byte *)((long)puVar20 + uStack_a0 + 2);
    puVar20 = (ushort *)((long)puVar20 + uStack_a0 + 3);
  }
  puVar11 = (ushort *)(pbVar1 + -0xf);
  uVar9 = 0xffffffffffffffff;
  uVar13 = uVar9;
  puVar12 = puVar20;
  if (((puVar20 < puVar11) && (puVar12 = puVar21 + 1, puVar12 <= puVar11)) &&
     (uVar13 = (ulong)(byte)*puVar20, (ulong)(byte)*puVar20 == 0xff)) {
    uVar19 = 0xff;
    puVar21 = (ushort *)((long)puVar21 + 3);
    do {
      puVar12 = puVar21;
      uVar13 = uVar9;
      if (puVar11 < puVar12) break;
      uVar19 = uVar19 + *(byte *)((long)puVar12 + -1);
      uVar13 = uVar19;
      puVar21 = (ushort *)((long)puVar12 + 1);
    } while ((ulong)*(byte *)((long)puVar12 + -1) == 0xff);
  }
  puVar20 = puVar12;
  uStack_a0 = 0xf;
  cVar6 = '\x05';
  if ((uVar13 != 0xffffffffffffffff) &&
     (uStack_a0 = uVar13 + 0xf, !CARRY8((ulong)pbVar15,uStack_a0))) {
    cVar6 = CARRY8((ulong)puVar20,uStack_a0) * '\x05';
  }
  if (cVar6 == '\0') {
LAB_0010d8dd:
    pbVar16 = pbVar15 + uStack_a0;
    if ((pbVar2 + -0xc < pbVar16) ||
       (puVar21 = (ushort *)(uStack_a0 + (long)puVar20), pbVar1 + -8 < puVar21)) {
      pbVar17 = pbVar16;
      if (pbVar1 < (byte *)(uStack_a0 + (long)puVar20)) {
        pbVar17 = pbVar15 + ((long)pbVar1 - (long)puVar20);
        uStack_a0 = (long)pbVar1 - (long)puVar20;
      }
      __n = (long)pbVar2 - (long)pbVar15;
      if (pbVar17 <= pbVar2) {
        __n = uStack_a0;
      }
      memmove(pbVar15,puVar20,__n);
      pbVar16 = pbVar15 + __n;
      if ((pbVar2 <= pbVar17) || (puVar21 = (ushort *)((long)puVar20 + __n), pbVar1 + -2 <= puVar21)
         ) goto LAB_0010dbf3;
    }
    else {
      do {
        *(undefined8 *)pbVar15 = *(undefined8 *)puVar20;
        pbVar15 = pbVar15 + 8;
        puVar20 = puVar20 + 4;
      } while (pbVar15 < pbVar16);
    }
    uVar13 = (ulong)*puVar21;
    puVar21 = puVar21 + 1;
    pbVar14 = pbVar16 + -uVar13;
    uVar9 = (ulong)(uVar22 & 0xf);
LAB_0010d986:
    if ((int)uVar9 == 0xf) {
      puVar11 = (ushort *)((long)puVar21 + 1);
      uVar19 = 0xffffffffffffffff;
      if ((puVar11 <= pbVar1 + -4) &&
         (uVar19 = (ulong)(byte)*puVar21, (ulong)(byte)*puVar21 == 0xff)) {
        uVar9 = 0xff;
        puVar21 = puVar21 + 1;
        do {
          puVar11 = puVar21;
          uVar19 = 0xffffffffffffffff;
          if (pbVar1 + -4 < puVar11) break;
          uVar9 = uVar9 + *(byte *)((long)puVar11 + -1);
          uVar19 = uVar9;
          puVar21 = (ushort *)((long)puVar11 + 1);
        } while ((ulong)*(byte *)((long)puVar11 + -1) == 0xff);
      }
      uVar9 = uVar19 + 0xf;
      if ((uVar19 == 0xffffffffffffffff) || (puVar21 = puVar11, CARRY8((ulong)pbVar16,uVar9)))
      goto LAB_0010dbe1;
    }
    uVar9 = uVar9 + 4;
    puVar11 = puVar21;
    pbVar17 = pbVar16;
    goto LAB_0010d9e2;
  }
  puVar11 = puVar20;
  puVar21 = puVar20;
  if (cVar6 != '\x05') goto LAB_0010dbf9;
LAB_0010dbe1:
  local_78 = (int)source;
  puVar21 = (ushort *)(ulong)(~(uint)puVar11 + local_78);
LAB_0010dbf9:
  return (int)puVar21;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_partial_forceExtDict(const char* source, char* dest,
                                     int compressedSize, int targetOutputSize, int dstCapacity,
                                     const void* dictStart, size_t dictSize)
{
    dstCapacity = MIN(targetOutputSize, dstCapacity);
    return LZ4_decompress_generic(source, dest, compressedSize, dstCapacity,
                                  partial_decode, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}